

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O2

void util::from_utf8(string *from,string *to,codepage_id codepage)

{
  ostringstream *this;
  bool bVar1;
  size_t j;
  byte *pbVar2;
  ulong uVar3;
  uint uVar4;
  uint *puVar5;
  byte *pbVar6;
  logger local_1b0;
  
  if (from->_M_string_length == 0) {
    to->_M_string_length = 0;
    *(to->_M_dataplus)._M_p = '\0';
  }
  else {
    if ((codepage == 0xfde9) ||
       ((bVar1 = anon_unknown_0::is_extended_ascii(codepage), bVar1 &&
        (bVar1 = anon_unknown_0::is_ascii(from), bVar1)))) {
      std::__cxx11::string::_M_assign((string *)to);
      return;
    }
    if (codepage == 0x4e4) {
      to->_M_string_length = 0;
      *(to->_M_dataplus)._M_p = '\0';
      std::__cxx11::string::reserve((ulong)to);
      bVar1 = false;
      pbVar6 = (byte *)(from->_M_dataplus)._M_p;
      pbVar2 = pbVar6;
      while (pbVar2 != pbVar6 + from->_M_string_length) {
        uVar4 = (uint)*pbVar2;
        if ((char)*pbVar2 < '\0') {
          uVar4 = 0x5f;
        }
        if (0xff < uVar4 || (uVar4 & 0xe0) == 0x80) {
          puVar5 = &(anonymous_namespace)::windows1252_replacements;
          for (uVar3 = 0; uVar3 != 0x20; uVar3 = uVar3 + 1) {
            if ((uVar4 == *puVar5) && ((0x2001a002UL >> (uVar3 & 0x3f) & 1) == 0))
            goto LAB_001488eb;
            puVar5 = puVar5 + 1;
          }
          bVar1 = true;
        }
LAB_001488eb:
        std::__cxx11::string::push_back((char)to);
        pbVar2 = pbVar2 + 1;
        pbVar6 = (byte *)(from->_M_dataplus)._M_p;
      }
      if (bVar1) {
        local_1b0.level = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.buffer);
        std::operator<<((ostream *)&local_1b0.buffer,
                        "Unsupported character while converting from UTF-8 to Windows-1252.");
        logger::~logger(&local_1b0);
      }
    }
    else {
      if (codepage == 0x4b0) {
        wtf8_to_utf16le(from,to);
        return;
      }
      bVar1 = anon_unknown_0::utf8_iconv(from,to,codepage,true);
      if (!bVar1) {
        this = &local_1b0.buffer;
        local_1b0.level = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::operator<<((ostream *)this,"Unsupported output codepage: ");
        std::ostream::_M_insert<unsigned_long>((ulong)this);
        logger::~logger(&local_1b0);
        std::__cxx11::string::_M_assign((string *)to);
      }
    }
  }
  return;
}

Assistant:

void from_utf8(const std::string & from, std::string & to, codepage_id codepage) {
	
	if(from.empty()) {
		to.clear();
		return;
	}
	
	if(codepage == cp_utf8 || (is_extended_ascii(codepage) && is_ascii(from))) {
		to = from;
		return;
	}
	
	switch(codepage) {
		case cp_utf16le:     wtf8_to_utf16le(from, to); return;
		case cp_windows1252: utf8_to_windows1252(from, to); return;
		default: break;
	}
	
	#if INNOEXTRACT_HAVE_ICONV
	if(from_utf8_iconv(from, to, codepage)) {
		return;
	}
	#endif
	
	#if INNOEXTRACT_HAVE_WIN32_CONV
	if(from_utf8_win32(from, to, codepage)) {
		return;
	}
	#endif
	
	log_warning << "Unsupported output codepage: " << codepage;
	to = from;
	
}